

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseConfig.h
# Opt level: O1

vector<ConfigKey,_std::allocator<ConfigKey>_> * ConfigKey::available(void)

{
  vector<ConfigKey,_std::allocator<ConfigKey>_> *in_RDI;
  long lVar1;
  long *plVar2;
  initializer_list<ConfigKey> __l;
  allocator_type local_169;
  ConfigKey local_168 [5];
  long local_40 [5];
  
  query_max_edge();
  query_max_ngram();
  database_workers();
  merge_max_datasets();
  merge_max_files();
  iterator_gc_seconds();
  __l._M_len = 6;
  __l._M_array = local_168;
  std::vector<ConfigKey,_std::allocator<ConfigKey>_>::vector(in_RDI,__l,&local_169);
  lVar1 = -0x150;
  plVar2 = local_40;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -7;
    lVar1 = lVar1 + 0x38;
  } while (lVar1 != 0);
  return in_RDI;
}

Assistant:

static std::vector<ConfigKey> available() {
        return {
            query_max_edge(),     query_max_ngram(), database_workers(),
            merge_max_datasets(), merge_max_files(), iterator_gc_seconds(),
        };
    }